

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  vertex_index_t vVar3;
  ulong uVar4;
  void *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  runtime_error *this_00;
  pointer ppVar8;
  int in_EDX;
  vertex_index_t *in_RSI;
  int *in_RDI;
  string err;
  iterator pair;
  short thread_index;
  directed_flag_complex_boundary_cell_t bdry;
  int i;
  directed_flag_complex_cell_t cell;
  unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  *in_stack_fffffffffffffec8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffed0;
  vector<float,_std::allocator<float>_> *pvVar9;
  directed_flag_complex_cell_t *in_stack_fffffffffffffed8;
  string local_f0 [22];
  unsigned_short in_stack_ffffffffffffff26;
  directed_flag_complex_cell_t *in_stack_ffffffffffffff28;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  _Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true> local_60;
  _Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true> local_58;
  short local_4a;
  directed_flag_complex_boundary_cell_t local_48;
  int local_2c;
  directed_flag_complex_cell_t local_28;
  int local_14;
  
  *in_RDI = *in_RDI + 1;
  local_14 = in_EDX;
  directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_28,in_RSI);
  if ((uint)cell_hasher_t::dimension != local_14 - 2U) {
    cell_hasher_t::set_current_cell_dimension((short)local_14 - 2);
  }
  if (*(long *)(in_RDI + 6) != 0) {
    uVar4 = (**(code **)(**(long **)(in_RDI + 6) + 0x28))();
    if ((uVar4 & 1) == 0) {
      pvVar9 = (vector<float,_std::allocator<float>_> *)(in_RDI + 10);
      (**(code **)(**(long **)(in_RDI + 6) + 0x10))
                (*(long **)(in_RDI + 6),(short)local_14 + -1,&local_28,*(undefined8 *)(in_RDI + 2),0
                );
      std::vector<float,_std::allocator<float>_>::push_back
                (pvVar9,(value_type_conflict2 *)in_stack_fffffffffffffec8);
    }
    else {
      if (*(long *)(in_RDI + 4) == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_14;
        uVar4 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        pvVar5 = operator_new__(uVar4);
        *(void **)(in_RDI + 4) = pvVar5;
      }
      for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
        directed_flag_complex_cell_t::boundary
                  (in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
        sVar6 = std::
                vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                ::size(*(vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                         **)(in_RDI + 0x10));
        if (sVar6 == 0) {
          pvVar9 = *(vector<float,_std::allocator<float>_> **)(in_RDI + 8);
          vVar3 = directed_flag_complex_boundary_cell_t::vertex(&local_48,0);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar9,(ulong)vVar3);
          *(value_type *)(*(long *)(in_RDI + 4) + (long)local_2c * 4) = *pvVar7;
        }
        else {
          vVar3 = directed_flag_complex_boundary_cell_t::vertex(&local_48,0);
          local_4a = (short)((ulong)vVar3 % *(ulong *)(in_RDI + 0x12));
          std::
          vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
          ::operator[](*(vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                         **)(in_RDI + 0x10),(long)local_4a);
          local_58._M_cur =
               (__node_type *)
               std::
               unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
               ::find(in_stack_fffffffffffffec8,(key_type *)0x1ab7b9);
          std::
          vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
          ::operator[](*(vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                         **)(in_RDI + 0x10),(long)local_4a);
          local_60._M_cur =
               (__node_type *)
               std::
               unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
               ::end(in_stack_fffffffffffffec8);
          bVar2 = std::__detail::operator==(&local_58,&local_60);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_80,"Could not find boundary ",&local_81);
            std::allocator<char>::~allocator((allocator<char> *)&local_81);
            directed_flag_complex_cell_t::boundary
                      (in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
            directed_flag_complex_cell_t::to_string_abi_cxx11_
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff26);
            std::__cxx11::string::operator+=(local_80,local_b8);
            std::__cxx11::string::~string(local_b8);
            std::__cxx11::string::operator+=(local_80," of ");
            directed_flag_complex_cell_t::to_string_abi_cxx11_
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff26);
            std::__cxx11::string::operator+=(local_80,local_f0);
            std::__cxx11::string::~string(local_f0);
            std::__cxx11::string::operator+=(local_80,".\n");
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,local_80);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar9 = *(vector<float,_std::allocator<float>_> **)(in_RDI + 8);
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_false,_true>
                                 *)0x1aba19);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar9,ppVar8->second +
                                     *(long *)(*(long *)(in_RDI + 0x14) + (long)local_4a * 8));
          *(value_type *)(*(long *)(in_RDI + 4) + (long)local_2c * 4) = *pvVar7;
        }
      }
      (**(code **)(**(long **)(in_RDI + 6) + 0x10))
                (*(long **)(in_RDI + 6),(short)local_14 + -1,&local_28,*(undefined8 *)(in_RDI + 2),
                 *(undefined8 *)(in_RDI + 4));
      std::vector<float,_std::allocator<float>_>::push_back
                (in_stack_fffffffffffffed0,(value_type_conflict2 *)in_stack_fffffffffffffec8);
    }
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;
		directed_flag_complex_cell_t cell(first_vertex);
		if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

		if (filtration_algorithm == nullptr) return;

		if (filtration_algorithm->needs_face_filtration()) {
			if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

			for (int i = 0; i < size; i++) {
				auto bdry = cell.boundary(i);

				if (!cell_hash.size()) {
					// In the case where no cell hash is given, we are looking
					// at edges
					assert(size == 2);
					boundary_filtration[i] = current_filtration[bdry.vertex(0)];
				} else {
					// The threads are split by the first vertex
					const short thread_index = bdry.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(bdry);

					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find boundary ";
						err += cell.boundary(i).to_string(size - 2);
						err += " of ";
						err += cell.to_string(size - 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					boundary_filtration[i] = current_filtration[pair->second + cell_hash_offsets[thread_index]];
				}
			}

			next_filtration.push_back(
			    filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration));
		} else {
			next_filtration.push_back(filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr));
		}
	}